

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *param,
          SpectrumType spectrumType,Allocator alloc)

{
  ulong uVar1;
  double *pdVar2;
  size_type sVar3;
  Allocator alloc_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  memory_resource **ppmVar7;
  int iVar8;
  RGBIlluminantSpectrum *this_00;
  ulong uVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  iterator iVar10;
  mapped_type *pmVar11;
  uintptr_t uVar12;
  ParameterDictionary *pPVar13;
  string *name;
  char *fmt;
  long lVar14;
  long lVar15;
  size_t i;
  size_type sVar16;
  long lVar17;
  RGBColorSpace *cs;
  ulong uVar18;
  long lVar19;
  span<const_float> l;
  span<const_float> v_00;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *v;
  vector<float,_std::allocator<float>_> value;
  string fn;
  memory_resource *local_250;
  undefined1 local_248 [24];
  undefined1 local_230 [12];
  undefined4 uStack_224;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_210;
  int local_204;
  char *local_200;
  ParameterDictionary *local_1f8;
  ParameterDictionary *local_1f0;
  int local_1e8;
  memory_resource **local_1e0;
  ParsedParameter local_1d8;
  ParsedParameter local_108;
  memory_resource **local_38;
  undefined4 extraout_var;
  
  local_250 = alloc.memoryResource;
  local_1f8 = this;
  iVar8 = std::__cxx11::string::compare((char *)param);
  if ((iVar8 == 0) ||
     ((*(char *)(Options + 0x2d) == '\x01' &&
      (iVar8 = std::__cxx11::string::compare((char *)param), iVar8 == 0)))) {
    local_248._0_4_ = 3;
    uVar1 = (param->numbers).nStored;
    if (uVar1 != 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar1;
      if (0x5555555555555555 < SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) {
        ErrorExit<std::__cxx11::string_const&,int&>
                  (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                   &param->name,(int *)local_248);
      }
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,uVar1 / 3,(allocator_type *)local_230);
      if (uVar1 < 3) {
        return __return_storage_ptr__;
      }
      uVar18 = 0;
      local_200 = "RGB parameter \"%s\" has negative component.";
      while( true ) {
        pdVar2 = (param->numbers).ptr;
        local_230._8_4_ = (undefined4)pdVar2[(long)(int)local_248._0_4_ * uVar18 + 2];
        auVar5 = vcvtpd2ps_avx(*(undefined1 (*) [16])(pdVar2 + (long)(int)local_248._0_4_ * uVar18))
        ;
        local_230._0_8_ = vmovlps_avx(auVar5);
        cs = param->colorSpace;
        if (cs == (RGBColorSpace *)0x0) {
          cs = local_1f8->colorSpace;
        }
        if (auVar5._0_4_ < 0.0) break;
        auVar4 = vmovshdup_avx(auVar5);
        if ((auVar4._0_4_ < 0.0) || ((float)local_230._8_4_ < 0.0)) break;
        if (spectrumType == Illuminant) {
          iVar8 = (*local_250->_vptr_memory_resource[2])(local_250,0x18,8);
          this_00 = (RGBIlluminantSpectrum *)CONCAT44(extraout_var_01,iVar8);
          RGBIlluminantSpectrum::RGBIlluminantSpectrum(this_00,cs,(RGB *)local_230);
          uVar9 = 0x6000000000000;
        }
        else if (spectrumType == Unbounded) {
          iVar8 = (*local_250->_vptr_memory_resource[2])(local_250,0x10,4);
          this_00 = (RGBIlluminantSpectrum *)CONCAT44(extraout_var_00,iVar8);
          RGBUnboundedSpectrum::RGBUnboundedSpectrum
                    ((RGBUnboundedSpectrum *)this_00,cs,(RGB *)local_230);
          uVar9 = 0x5000000000000;
        }
        else {
          if (spectrumType != Albedo) {
            LogFatal<char_const(&)[41]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                       ,0x188,"Check failed: %s",
                       (char (*) [41])"spectrumType == SpectrumType::Illuminant");
          }
          if (((1.0 < auVar5._0_4_) || (1.0 < auVar4._0_4_)) || (1.0 < (float)local_230._8_4_)) {
            local_200 = "RGB parameter \"%s\" has > 1 component.";
            break;
          }
          iVar8 = (*local_250->_vptr_memory_resource[2])(local_250,0xc,4);
          this_00 = (RGBIlluminantSpectrum *)CONCAT44(extraout_var,iVar8);
          RGBAlbedoSpectrum::RGBAlbedoSpectrum((RGBAlbedoSpectrum *)this_00,cs,(RGB *)local_230);
          uVar9 = 0x4000000000000;
        }
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar18].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (ulong)this_00 | uVar9;
        uVar18 = uVar18 + 1;
        if (uVar1 / 3 == uVar18) {
          return __return_storage_ptr__;
        }
      }
      ErrorExit<std::__cxx11::string_const&>(&param->loc,local_200,&param->name);
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)param);
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::string::compare((char *)param);
      if ((iVar8 != 0) || (uVar1 = (param->numbers).nStored, uVar1 == 0)) {
        iVar8 = std::__cxx11::string::compare((char *)param);
        if ((iVar8 != 0) || ((param->strings).nStored == 0)) {
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          return __return_storage_ptr__;
        }
        ParsedParameter::ParsedParameter(&local_108,param);
        local_38 = &local_250;
        sVar3 = (param->strings).nStored;
        if (sVar3 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,sVar3,(allocator_type *)local_230);
        lVar17 = 0;
        sVar16 = 0;
        do {
          name = (string *)((long)&(((param->strings).ptr)->_M_dataplus)._M_p + lVar17);
          GetNamedSpectrum((pbrt *)&local_210,name);
          if ((local_210.bits & 0xffffffffffff) == 0) {
            alloc_00.memoryResource = *local_38;
            ResolveFilename((string *)local_230,name);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                             *)cachedSpectra_abi_cxx11_,(key_type *)local_230);
            if (iVar10._M_node == (_Base_ptr)(cachedSpectra_abi_cxx11_ + 8)) {
              PiecewiseLinearSpectrum::Read
                        ((PiecewiseLinearSpectrum *)local_248,(string *)local_230,alloc_00);
              if (local_248[8] == '\0') {
                uVar12 = 0;
              }
              else {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                        *)cachedSpectra_abi_cxx11_,(key_type *)local_230);
                (pmVar11->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                ).bits = CONCAT44(local_248._4_4_,local_248._0_4_);
                if (local_248[8] == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x2813e7c);
                }
                uVar12 = CONCAT44(local_248._4_4_,local_248._0_4_);
              }
              if (local_248[8] == '\x01') {
                local_248[8] = '\0';
              }
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                      *)cachedSpectra_abi_cxx11_,(key_type *)local_230);
              uVar12 = (pmVar11->
                       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                       ).bits;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._0_8_ != &local_220) {
              operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
            }
            local_210.bits = uVar12;
            if ((uVar12 & 0xffffffffffff) == 0) {
              ErrorExit<std::__cxx11::string_const&>
                        (&local_108.loc,"%s: unable to read valid spectrum file",name);
            }
          }
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar16].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = local_210.bits;
          sVar16 = sVar16 + 1;
          lVar17 = lVar17 + 0x20;
        } while (sVar3 != sVar16);
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  (&local_108.bools);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108.strings);
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::~vector(&local_108.numbers)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
          operator_delete(local_108.name._M_dataplus._M_p,
                          local_108.name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.type._M_dataplus._M_p == &local_108.type.field_2) {
          return __return_storage_ptr__;
        }
LAB_001f6a3b:
        operator_delete(local_108.type._M_dataplus._M_p,
                        local_108.type.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      if ((uVar1 & 1) == 0) {
        local_1f0 = local_1f8;
        local_1e8 = (int)(uVar1 >> 1);
        local_1e0 = &local_250;
        ParsedParameter::ParsedParameter(&local_1d8,param);
        local_204 = (int)uVar1;
        uVar1 = (param->numbers).nStored;
        if (uVar1 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        uVar18 = (ulong)local_204;
        if (uVar1 % uVar18 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     &param->name,&local_204);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,(size_type)(uVar1 / uVar18),(allocator_type *)local_230);
        if (uVar18 <= uVar1) {
          lVar17 = 0;
          pPVar13 = (ParameterDictionary *)0x0;
          local_1f8 = (ParameterDictionary *)(uVar1 / uVar18);
          do {
            iVar8 = local_204;
            pdVar2 = (param->numbers).ptr;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_230,(long)local_1e8,
                       (allocator_type *)local_248);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_248,(long)local_1e8,
                       (allocator_type *)&local_210);
            ppmVar7 = local_1e0;
            if (0 < (long)local_1e8) {
              lVar19 = iVar8 * lVar17;
              iVar8 = -1;
              lVar14 = 0;
              lVar15 = 0;
              do {
                if ((lVar15 != 0) &&
                   (*(double *)((long)pdVar2 + lVar15 * 4 + lVar19) <=
                    (double)*(float *)(local_230._0_8_ + lVar15 + -4))) {
                  local_210.bits._0_4_ = iVar8;
                  ErrorExit<int,float&,double_const&>
                            (&local_1d8.loc,
                             "Spectrum description invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                             ,(int *)&local_210,(float *)(local_230._0_8_ + lVar15 + -4),
                             (double *)((long)pdVar2 + (lVar19 - lVar14)));
                }
                *(float *)(local_230._0_8_ + lVar15) =
                     (float)*(double *)((long)pdVar2 + lVar15 * 4 + lVar19);
                *(float *)(CONCAT44(local_248._4_4_,local_248._0_4_) + lVar15) =
                     (float)*(double *)((long)pdVar2 + lVar15 * 4 + lVar19 + 8);
                lVar15 = lVar15 + 4;
                iVar8 = iVar8 + 1;
                lVar14 = lVar14 + -0x10;
              } while ((long)local_1e8 * 4 != lVar15);
            }
            iVar8 = (*(*local_1e0)->_vptr_memory_resource[2])(*local_1e0,0x40,8);
            l.n = CONCAT44(uStack_224,local_230._8_4_) - local_230._0_8_ >> 2;
            v_00.n = CONCAT71(local_248._9_7_,local_248[8]) -
                     (long)CONCAT44(local_248._4_4_,local_248._0_4_) >> 2;
            l.ptr = (float *)local_230._0_8_;
            v_00.ptr = (float *)CONCAT44(local_248._4_4_,local_248._0_4_);
            PiecewiseLinearSpectrum::PiecewiseLinearSpectrum
                      ((PiecewiseLinearSpectrum *)CONCAT44(extraout_var_03,iVar8),l,v_00,*ppmVar7);
            pvVar6 = (void *)CONCAT44(local_248._4_4_,local_248._0_4_);
            if (pvVar6 != (void *)0x0) {
              operator_delete(pvVar6,local_248._16_8_ - (long)pvVar6);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_230._0_8_,
                              local_220._M_allocated_capacity - local_230._0_8_);
            }
            (__return_storage_ptr__->
            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl
            .super__Vector_impl_data._M_start[(long)pPVar13].
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits = CONCAT44(extraout_var_03,iVar8) | 0x3000000000000;
            pPVar13 = (ParameterDictionary *)((long)&(pPVar13->params).alloc.memoryResource + 1);
            lVar17 = lVar17 + 8;
          } while (pPVar13 < local_1f8);
        }
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  (&local_1d8.bools);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8.strings);
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::~vector(&local_1d8.numbers)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
          operator_delete(local_1d8.name._M_dataplus._M_p,
                          local_1d8.name.field_2._M_allocated_capacity + 1);
        }
        local_108.type.field_2._M_allocated_capacity = local_1d8.type.field_2._M_allocated_capacity;
        local_108.type._M_dataplus._M_p = local_1d8.type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.type._M_dataplus._M_p == &local_1d8.type.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_001f6a3b;
      }
      fmt = "Found odd number of values for \"%s\"";
      goto LAB_001f6aea;
    }
    sVar3 = (param->numbers).nStored;
    if (sVar3 != 0) {
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,sVar3,(allocator_type *)local_230);
      sVar16 = 0;
      do {
        pdVar2 = (param->numbers).ptr;
        iVar8 = (*local_250->_vptr_memory_resource[2])(local_250,8,4);
        BlackbodySpectrum::BlackbodySpectrum
                  ((BlackbodySpectrum *)CONCAT44(extraout_var_02,iVar8),(float)pdVar2[sVar16]);
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar16].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits = CONCAT44(extraout_var_02,iVar8) | 0x7000000000000;
        sVar16 = sVar16 + 1;
      } while (sVar3 != sVar16);
      return __return_storage_ptr__;
    }
  }
  fmt = "No values provided for \"%s\".";
LAB_001f6aea:
  ErrorExit<std::__cxx11::string_const&>(&param->loc,fmt,&param->name);
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                    ErrorExit(loc, "RGB parameter \"%s\" has negative component.",
                              param.name);
                if (spectrumType == SpectrumType::Albedo) {
                    if (rgb.r > 1 || rgb.g > 1 || rgb.b > 1)
                        ErrorExit(loc, "RGB parameter \"%s\" has > 1 component.",
                                  param.name);
                    return alloc.new_object<RGBAlbedoSpectrum>(cs, rgb);
                } else if (spectrumType == SpectrumType::Unbounded) {
                    return alloc.new_object<RGBUnboundedSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::Illuminant);
                    return alloc.new_object<RGBIlluminantSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}